

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall kj::anon_unknown_59::InMemoryFile::stat(InMemoryFile *this,char *__file,stat *__buf)

{
  Exception *pEVar1;
  long lVar2;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Maybe<kj::_::Mutex::Waiter_&> local_20;
  
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd8
             ,__file + 0x18);
  *(undefined4 *)&(this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode = 0;
  pEVar1 = ((local_20.ptr)->exception).ptr.ptr;
  lVar2 = (((Date *)&(local_20.ptr)->futex)->value).value;
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)pEVar1;
  *(Exception **)&(this->super_AtomicRefcounted).refcount = pEVar1;
  *(long *)&(this->impl).mutex = lVar2;
  *(undefined4 *)&(this->impl).mutex.waitersHead.ptr = 1;
  (this->impl).mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)__file;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)&stack0xffffffffffffffd8
            );
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::FILE, lock->size, lock->size, lock->lastModified, 1, hash };
  }